

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O2

string * __thiscall
glcts::TextureBufferTextureBufferRange::getVertexShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TextureBufferTextureBufferRange *this,FormatInfo *info)

{
  ostream *poVar1;
  char *pcVar2;
  stringstream result;
  char *local_208 [4];
  char *local_1e8 [4];
  char *local_1c8 [4];
  stringstream local_1a8 [16];
  ostream local_198;
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  pcVar2 = fixed_sample_locations_values + 1;
  if ((info->m_output_type & 0xfffffffe) == 0x1404) {
    pcVar2 = "flat ";
  }
  poVar1 = std::operator<<(&local_198,
                           "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\nprecision highp float;\n\nuniform highp "
                          );
  std::__cxx11::string::string((string *)local_1c8,(string *)&info->m_sampler_type_name);
  poVar1 = std::operator<<(poVar1,local_1c8[0]);
  poVar1 = std::operator<<(poVar1,
                           " sampler_buffer;\n\nlayout(location = 0 ) out flat int outTextureSize;\nlayout(location = 1 ) out "
                          );
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::__cxx11::string::string((string *)local_1e8,(string *)&info->m_output_type_name);
  poVar1 = std::operator<<(poVar1,local_1e8[0]);
  poVar1 = std::operator<<(poVar1,
                           " outValue;\nvoid main(void)\n{\n    outValue       = texelFetch ( sampler_buffer, 0)"
                          );
  std::__cxx11::string::string((string *)local_208,(string *)&info->m_value_selector);
  poVar1 = std::operator<<(poVar1,local_208[0]);
  std::operator<<(poVar1,
                  ";\n    outTextureSize = textureSize( sampler_buffer );\n    gl_Position    = vec4(0.0f, 0.0f, 0.0f, 0.0f);\n}\n"
                 );
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBufferTextureBufferRange::getVertexShaderCode(FormatInfo& info) const
{
	std::stringstream result;

	const char* pszInterpolationQualifier = "";

	if (info.get_output_type() == GL_UNSIGNED_INT || info.get_output_type() == GL_INT)
	{
		pszInterpolationQualifier = "flat ";
	}

	result << "${VERSION}\n"
			  "\n"
			  "${TEXTURE_BUFFER_REQUIRE}\n"
			  "\n"
			  "precision highp float;\n"
			  "\n"
			  "uniform highp "
		   << info.get_sampler_type_name().c_str() << " sampler_buffer;\n"
													  "\n"
													  "layout(location = 0 ) out flat int outTextureSize;\n"
													  "layout(location = 1 ) out "
		   << pszInterpolationQualifier << info.get_output_type_name().c_str()
		   << " outValue;\n"
			  "void main(void)\n"
			  "{\n"
			  "    outValue       = texelFetch ( sampler_buffer, 0)"
		   << info.get_value_selector().c_str() << ";\n"
												   "    outTextureSize = textureSize( sampler_buffer );\n"
												   "    gl_Position    = vec4(0.0f, 0.0f, 0.0f, 0.0f);\n"
												   "}\n";

	return result.str();
}